

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_loop::translate
          (method_loop *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw,tree_type<cs::token_base_*> *cond)

{
  int iVar1;
  element_type *b;
  iterator ptr_00;
  token_base *ptr_01;
  bool *pbVar2;
  statement_base *psVar3;
  token_base *ptr;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffcf8;
  compiler_type *in_stack_fffffffffffffd00;
  _Self *in_stack_fffffffffffffd08;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffd10;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  statement_block *this_01;
  tree_type<cs::token_base_*> *expr;
  statement_loop_until *this_02;
  allocator_type *__a;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  element_type *in_stack_fffffffffffffd78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd80;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffdb8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffdc0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_218;
  undefined4 local_1b8;
  undefined1 local_1b1;
  tree_node *local_150;
  token_value *local_148;
  allocator_type local_129;
  undefined1 local_128 [64];
  tree_type<cs::token_base_*> local_e8 [28];
  statement_base *local_8;
  
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x1b6f24);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b6f31);
  b = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1b6f39);
  this_01 = (statement_block *)(local_128 + 0x20);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin(in_stack_fffffffffffffcf8);
  expr = local_e8;
  std::operator+(in_stack_fffffffffffffd08,(difference_type)in_stack_fffffffffffffd00);
  this_02 = (statement_loop_until *)local_128;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end(in_stack_fffffffffffffcf8);
  __a = &local_129;
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x1b6fa0
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffd80._M_pi,
             (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              *)in_stack_fffffffffffffd78,
             (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),__a);
  compiler_type::translate
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x1b6fd8);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)this_01);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x1b6ff4
            );
  ptr_00 = tree_type<cs::token_base_*>::root
                     ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffcf8);
  local_150 = ptr_00.mData;
  ptr_01 = (token_base *)tree_type<cs::token_base_*>::iterator::data((iterator *)ptr_00.mData);
  local_148 = (token_value *)ptr_01->_vptr_token_base;
  if (local_148 != (token_value *)0x0) {
    iVar1 = (*(local_148->super_token_base)._vptr_token_base[2])();
    if (iVar1 == 7) {
      token_value::get_value(local_148);
      pbVar2 = cs_impl::any::const_val<bool>((any *)in_stack_fffffffffffffd80._M_pi);
      if ((*pbVar2 & 1U) == 0) {
        psVar3 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffd00);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        this_00 = &local_218;
        std::shared_ptr<cs::context_type>::shared_ptr
                  ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffd00,
                   (shared_ptr<cs::context_type> *)in_stack_fffffffffffffcf8);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)this_00);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_00);
        statement_loop::statement_loop
                  ((statement_loop *)this_01,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)b,
                   (context_t *)ptr_00.mData,ptr_01);
        local_8 = psVar3;
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1b72a1);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_01);
      }
      else {
        psVar3 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffd00);
        local_1b1 = 1;
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        std::shared_ptr<cs::context_type>::shared_ptr
                  ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffd00,
                   (shared_ptr<cs::context_type> *)in_stack_fffffffffffffcf8);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)in_stack_fffffffffffffd10);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                  (in_stack_fffffffffffffd10);
        statement_block::statement_block
                  (this_01,(deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)b,
                   (context_t *)ptr_00.mData,ptr_01);
        local_1b1 = 0;
        local_8 = psVar3;
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1b7126);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_01);
      }
      goto LAB_001b7476;
    }
  }
  psVar3 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffd00);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd00,
             (tree_type<cs::token_base_*> *)in_stack_fffffffffffffcf8);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)&stack0xfffffffffffffd78,
             (shared_ptr<cs::context_type> *)in_stack_fffffffffffffcf8);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffd10);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(in_stack_fffffffffffffd10);
  statement_loop_until::statement_loop_until
            (this_02,expr,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_01,
             (context_t *)b,(token_base *)ptr_00.mData);
  local_8 = psVar3;
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1b73d3);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_01);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x1b73ed);
LAB_001b7476:
  local_1b8 = 1;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_01);
  return local_8;
}

Assistant:

statement_base *method_loop::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw,
	                                       const tree_type<token_base *> &cond)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		token_base *ptr = cond.root().data();
		if (ptr != nullptr && ptr->get_type() == token_types::value) {
			if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
				return new statement_block(body, context, raw.front().back());
			else
				return new statement_loop(body, context, raw.front().back());
		}
		else
			return new statement_loop_until(cond, body, context, raw.front().back());
	}